

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,int opNum,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  uint RegNo;
  sparc_reg sVar3;
  int32_t iVar4;
  MCOperand *op;
  uint8_t *puVar5;
  int64_t iVar6;
  MCOperand *MO;
  uint reg;
  int Imm;
  SStream *O_local;
  int opNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,opNum);
  _Var2 = MCOperand_isReg(op);
  if (_Var2) {
    RegNo = MCOperand_getReg(op);
    printRegName(O,RegNo);
    sVar3 = Sparc_map_register(RegNo);
    if (MI->csh->detail != CS_OPT_OFF) {
      if ((MI->csh->doing_mem & 1U) == 0) {
        puVar5 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1a;
        puVar5[0] = '\x01';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        *(sparc_reg *)
         (MI->flat_insn->detail->groups +
         (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e) = sVar3;
        pcVar1 = MI->flat_insn->detail;
        (pcVar1->field_6).x86.rex = (pcVar1->field_6).x86.rex + '\x01';
      }
      else if (MI->flat_insn->detail->groups
               [(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e] == '\0') {
        MI->flat_insn->detail->groups[(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e]
             = (uint8_t)sVar3;
      }
      else {
        MI->flat_insn->detail->groups[(ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1f]
             = (uint8_t)sVar3;
      }
    }
  }
  else {
    _Var2 = MCOperand_isImm(op);
    if (_Var2) {
      iVar6 = MCOperand_getImm(op);
      MO._4_4_ = (uint32_t)iVar6;
      switch(MI->Opcode) {
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x95:
      case 0x96:
        iVar4 = SignExtend32(MO._4_4_,0x16);
        MO._4_4_ = (int)MI->address + iVar4 * 4;
        break;
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
        iVar4 = SignExtend32(MO._4_4_,0x13);
        MO._4_4_ = (int)MI->address + iVar4 * 4;
        break;
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x62:
      case 99:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
        iVar4 = SignExtend32(MO._4_4_,0x10);
        MO._4_4_ = (int)MI->address + iVar4 * 4;
        break;
      case 0x72:
        iVar4 = SignExtend32(MO._4_4_,0x1e);
        MO._4_4_ = (int)MI->address + iVar4;
      }
      if ((int)MO._4_4_ < 0) {
        if ((int)MO._4_4_ < -9) {
          SStream_concat(O,"-0x%x",(ulong)-MO._4_4_);
        }
        else {
          SStream_concat(O,"-%u",(ulong)-MO._4_4_);
        }
      }
      else if ((int)MO._4_4_ < 10) {
        SStream_concat(O,"%u",(ulong)MO._4_4_);
      }
      else {
        SStream_concat(O,"0x%x",(ulong)MO._4_4_);
      }
      if (MI->csh->detail != CS_OPT_OFF) {
        if ((MI->csh->doing_mem & 1U) == 0) {
          puVar5 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1a;
          puVar5[0] = '\x02';
          puVar5[1] = '\0';
          puVar5[2] = '\0';
          puVar5[3] = '\0';
          *(uint32_t *)
           (MI->flat_insn->detail->groups +
           (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x1e) = MO._4_4_;
          pcVar1 = MI->flat_insn->detail;
          (pcVar1->field_6).x86.rex = (pcVar1->field_6).x86.rex + '\x01';
        }
        else {
          *(uint32_t *)
           (MI->flat_insn->detail->groups +
           (ulong)(MI->flat_insn->detail->field_6).x86.rex * 0xc + 0x22) = MO._4_4_;
        }
      }
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	uint8_t opsize = 0;
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);

	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);

		printRegName(O, reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.op_count++;
			}
		}

		if (MI->op1_size == 0)
			MI->op1_size = MI->csh->regsize_map[reg];
	} else if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op);

		switch(MCInst_getOpcode(MI)) {
			default:
				break;

			case X86_AAD8i8:
			case X86_AAM8i8:
			case X86_ADC8i8:
			case X86_ADD8i8:
			case X86_AND8i8:
			case X86_CMP8i8:
			case X86_OR8i8:
			case X86_SBB8i8:
			case X86_SUB8i8:
			case X86_TEST8i8:
			case X86_XOR8i8:
			case X86_ROL8ri:
			case X86_ADC8ri:
			case X86_ADD8ri:
			case X86_ADD8ri8:
			case X86_AND8ri:
			case X86_AND8ri8:
			case X86_CMP8ri:
			case X86_MOV8ri:
			case X86_MOV8ri_alt:
			case X86_OR8ri:
			case X86_OR8ri8:
			case X86_RCL8ri:
			case X86_RCR8ri:
			case X86_ROR8ri:
			case X86_SAL8ri:
			case X86_SAR8ri:
			case X86_SBB8ri:
			case X86_SHL8ri:
			case X86_SHR8ri:
			case X86_SUB8ri:
			case X86_SUB8ri8:
			case X86_TEST8ri:
			case X86_TEST8ri_NOREX:
			case X86_TEST8ri_alt:
			case X86_XOR8ri:
			case X86_XOR8ri8:
			case X86_OUT8ir:

			case X86_ADC8mi:
			case X86_ADD8mi:
			case X86_AND8mi:
			case X86_CMP8mi:
			case X86_LOCK_ADD8mi:
			case X86_LOCK_AND8mi:
			case X86_LOCK_OR8mi:
			case X86_LOCK_SUB8mi:
			case X86_LOCK_XOR8mi:
			case X86_MOV8mi:
			case X86_OR8mi:
			case X86_RCL8mi:
			case X86_RCR8mi:
			case X86_ROL8mi:
			case X86_ROR8mi:
			case X86_SAL8mi:
			case X86_SAR8mi:
			case X86_SBB8mi:
			case X86_SHL8mi:
			case X86_SHR8mi:
			case X86_SUB8mi:
			case X86_TEST8mi:
			case X86_TEST8mi_alt:
			case X86_XOR8mi:
			case X86_PUSH64i8:
			case X86_CMP32ri8:
			case X86_CMP64ri8:

				imm = imm & 0xff;
				opsize = 1;     // immediate of 1 byte
				break;
		}

		switch(MI->flat_insn->id) {
			default:
				if (imm >= 0) {
					if (imm > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, imm);
					else
						SStream_concat(O, "%"PRIu64, imm);
				} else {
					if (imm < -HEX_THRESHOLD)
						SStream_concat(O, "-0x%"PRIx64, -imm);
					else
						SStream_concat(O, "-%"PRIu64, -imm);
				}

				break;

			case X86_INS_LCALL:
			case X86_INS_LJMP:
				// always print address in positive form
				if (OpNo == 1) {	// selector is ptr16
					imm = imm & 0xffff;
					opsize = 2;
				}
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
				break;

			case X86_INS_AND:
			case X86_INS_OR:
			case X86_INS_XOR:
				// do not print number in negative form
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "%u", imm);
				else {
					imm = arch_masks[MI->op1_size? MI->op1_size : MI->imm_size] & imm;
					SStream_concat(O, "0x%"PRIx64, imm);
				}
				break;
			case X86_INS_RET:
				// RET imm16
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					SStream_concat(O, "%u", imm);
				else {
					imm = 0xffff & imm;
					SStream_concat(O, "0x%x", 0xffff & imm);
				}
				break;
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = imm;
			} else {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
				if (opsize > 0)
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = opsize;
				else if (MI->flat_insn->detail->x86.op_count > 0) {
					if (MI->flat_insn->id != X86_INS_LCALL && MI->flat_insn->id != X86_INS_LJMP) {
						MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size =
							MI->flat_insn->detail->x86.operands[0].size;
					} else
						MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;
				} else
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;

				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
				MI->flat_insn->detail->x86.op_count++;
			}
		}

		//if (MI->op1_size == 0)
		//	MI->op1_size = MI->imm_size;
	}
}